

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strscpy.c
# Opt level: O1

int run_test_strscpy(void)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  size_t i;
  long lVar5;
  char cVar6;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  char *pcVar7;
  long *plVar8;
  int64_t eval_b;
  int64_t eval_a;
  char d [4];
  char local_18 [8];
  long local_10;
  uint local_4;
  
  pcVar7 = local_18;
  local_4 = 0;
  lVar5 = 0;
  do {
    *(char *)((long)&local_4 + lVar5) = "priority >= min && priority <= max"[lVar5 + 0x21];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  uVar3 = local_4 >> 0x18 | (local_4 & 0xff0000) >> 8 | (local_4 & 0xff00) << 8 | local_4 << 0x18;
  local_10 = (long)(int)((uint)(0x78000000 < uVar3) - (uint)(uVar3 < 0x78000000));
  if (local_10 == 0) {
    local_4 = 0;
    lVar5 = 0;
    do {
      *(char *)((long)&local_4 + lVar5) = "xy"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    uVar3 = local_4 >> 0x18 | (local_4 & 0xff0000) >> 8 | (local_4 & 0xff00) << 8 | local_4 << 0x18;
    local_10 = (long)(int)((uint)(0x78790000 < uVar3) - (uint)(uVar3 < 0x78790000));
    local_18[0] = '\0';
    local_18[1] = '\0';
    local_18[2] = '\0';
    local_18[3] = '\0';
    local_18[4] = '\0';
    local_18[5] = '\0';
    local_18[6] = '\0';
    local_18[7] = '\0';
    if (local_10 != 0) goto LAB_001c5463;
    lVar5 = 0;
    do {
      *(char *)((long)&local_4 + lVar5) = "xyz"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    uVar3 = local_4 >> 0x18 | (local_4 & 0xff0000) >> 8 | (local_4 & 0xff00) << 8 | local_4 << 0x18;
    local_10 = (long)(int)((uint)(0x78797a00 < uVar3) - (uint)(uVar3 < 0x78797a00));
    local_18[0] = '\0';
    local_18[1] = '\0';
    local_18[2] = '\0';
    local_18[3] = '\0';
    local_18[4] = '\0';
    local_18[5] = '\0';
    local_18[6] = '\0';
    local_18[7] = '\0';
    if (local_10 != 0) goto LAB_001c547d;
    lVar5 = 0;
    do {
      *(char *)((long)&local_4 + lVar5) = "xyzz"[lVar5];
      uVar3 = local_4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_4 = local_4 & 0xffffff;
    uVar3 = (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | local_4 << 0x18;
    local_10 = (long)(int)((uint)(0x78797a00 < uVar3) - (uint)(uVar3 < 0x78797a00));
    local_18[0] = '\0';
    local_18[1] = '\0';
    local_18[2] = '\0';
    local_18[3] = '\0';
    local_18[4] = '\0';
    local_18[5] = '\0';
    local_18[6] = '\0';
    local_18[7] = '\0';
    if (local_10 == 0) {
      lVar5 = 0;
      do {
        *(char *)((long)&local_4 + lVar5) = "xyzzy"[lVar5];
        uVar3 = local_4;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_4 = local_4 & 0xffffff;
      uVar3 = (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | local_4 << 0x18;
      local_10 = (long)(int)((uint)(0x78797a00 < uVar3) - (uint)(uVar3 < 0x78797a00));
      local_18[0] = '\0';
      local_18[1] = '\0';
      local_18[2] = '\0';
      local_18[3] = '\0';
      local_18[4] = '\0';
      local_18[5] = '\0';
      local_18[6] = '\0';
      local_18[7] = '\0';
      if (local_10 == 0) {
        return 0;
      }
      goto LAB_001c54b1;
    }
  }
  else {
    local_18[0] = '\0';
    local_18[1] = '\0';
    local_18[2] = '\0';
    local_18[3] = '\0';
    local_18[4] = '\0';
    local_18[5] = '\0';
    local_18[6] = '\0';
    local_18[7] = '\0';
    run_test_strscpy_cold_4();
    run_test_strscpy_cold_5();
LAB_001c5463:
    run_test_strscpy_cold_6();
    run_test_strscpy_cold_7();
LAB_001c547d:
    run_test_strscpy_cold_8();
    run_test_strscpy_cold_9();
  }
  run_test_strscpy_cold_10();
  run_test_strscpy_cold_11();
LAB_001c54b1:
  plVar8 = &local_10;
  run_test_strscpy_cold_12();
  if (plVar8 == (long *)0x0) {
    plVar8 = *(long **)CONCAT71(extraout_var,extraout_DL);
  }
  if (plVar8 != (long *)0x0) {
    cVar6 = (char)*plVar8;
    iVar4 = (int)plVar8;
    if (cVar6 != '\0') {
      cVar1 = *pcVar7;
      pcVar2 = pcVar7;
      do {
        while (cVar1 != '\0') {
          if (cVar6 == cVar1) {
            *(char **)CONCAT71(extraout_var,extraout_DL) = (char *)((long)plVar8 + 1);
            *(char *)plVar8 = '\0';
            return iVar4;
          }
          cVar1 = pcVar2[1];
          pcVar2 = pcVar2 + 1;
        }
        cVar6 = *(char *)((long)plVar8 + 1);
        plVar8 = (long *)((long)plVar8 + 1);
        cVar1 = *pcVar7;
        pcVar2 = pcVar7;
      } while (cVar6 != '\0');
    }
    *(undefined8 *)CONCAT71(extraout_var,extraout_DL) = 0;
    return iVar4;
  }
  return 0;
}

Assistant:

TEST_IMPL(strscpy) {
  char d[4];

  ASSERT_OK(uv__strscpy(d, "", 0));
  ASSERT_OK(uv__strscpy(d, "x", 0));

  memset(d, 0, sizeof(d));
  ASSERT_EQ(1, uv__strscpy(d, "x", sizeof(d)));
  ASSERT_OK(memcmp(d, "x\0\0", sizeof(d)));

  memset(d, 0, sizeof(d));
  ASSERT_EQ(2, uv__strscpy(d, "xy", sizeof(d)));
  ASSERT_OK(memcmp(d, "xy\0", sizeof(d)));

  ASSERT_EQ(3, uv__strscpy(d, "xyz", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  ASSERT_EQ(UV_E2BIG, uv__strscpy(d, "xyzz", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  ASSERT_EQ(UV_E2BIG, uv__strscpy(d, "xyzzy", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  return 0;
}